

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

BigInt * random_bigPrime(BigInt *__return_storage_ptr__,int bit_size)

{
  bool bVar1;
  BigInt local_40;
  
  if (seive.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      seive.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    init((EVP_PKEY_CTX *)__return_storage_ptr__);
  }
  random_bigint(__return_storage_ptr__,bit_size / 3);
  while( true ) {
    bVar1 = isPrime(__return_storage_ptr__,0x40);
    if (bVar1) break;
    BigInt::operator+(&local_40,__return_storage_ptr__,&one);
    __return_storage_ptr__->sign = local_40.sign;
    std::vector<long_long,_std::allocator<long_long>_>::operator=
              (&__return_storage_ptr__->vector_value,&local_40.vector_value);
    if (local_40.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt random_bigPrime(int bit_size) {
    if (seive.empty())
        init();

    BigInt rand(random_bigint(bit_size / 3)); //! bit_size/3 decimal digits log2(10) ~ 3
    while (!isPrime(rand))
        rand = rand + one; //! bit_size/3 decimal digits
    return rand;
}